

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjTable.hh
# Opt level: O0

void __thiscall
ObjTable<QPDFWriter::NewObject>::resize(ObjTable<QPDFWriter::NewObject> *this,size_t a_size)

{
  undefined4 uVar1;
  bool bVar2;
  bool bVar3;
  pointer ppVar4;
  reference pvVar5;
  pointer ppVar6;
  unsigned_long local_58;
  _Self local_28;
  iterator end;
  iterator it;
  size_t a_size_local;
  ObjTable<QPDFWriter::NewObject> *this_local;
  
  std::vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>::resize
            (&this->super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>,
             a_size);
  if (this->min_sparse < a_size) {
    end = std::
          map<unsigned_long,_QPDFWriter::NewObject,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFWriter::NewObject>_>_>
          ::begin(&this->sparse_elements);
    local_28._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_QPDFWriter::NewObject,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFWriter::NewObject>_>_>
         ::end(&this->sparse_elements);
    while( true ) {
      bVar2 = std::operator!=(&end,&local_28);
      bVar3 = false;
      if (bVar2) {
        ppVar6 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_QPDFWriter::NewObject>_>::
                 operator->(&end);
        bVar3 = ppVar6->first < a_size;
      }
      if (!bVar3) break;
      ppVar6 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_QPDFWriter::NewObject>_>::
               operator->(&end);
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_QPDFWriter::NewObject>_>::
               operator->(&end);
      pvVar5 = std::vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>::
               operator[](&this->
                           super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                          ,ppVar4->first);
      uVar1 = *(undefined4 *)&(ppVar6->second).xref.field_0x4;
      (pvVar5->xref).type = (ppVar6->second).xref.type;
      *(undefined4 *)&(pvVar5->xref).field_0x4 = uVar1;
      (pvVar5->xref).field1 = (ppVar6->second).xref.field1;
      uVar1 = *(undefined4 *)&(ppVar6->second).xref.field_0x14;
      (pvVar5->xref).field2 = (ppVar6->second).xref.field2;
      *(undefined4 *)&(pvVar5->xref).field_0x14 = uVar1;
      pvVar5->length = (ppVar6->second).length;
      end = std::
            map<unsigned_long,QPDFWriter::NewObject,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,QPDFWriter::NewObject>>>
            ::erase_abi_cxx11_((map<unsigned_long,QPDFWriter::NewObject,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,QPDFWriter::NewObject>>>
                                *)&this->sparse_elements,end);
    }
    bVar3 = std::operator==(&end,&local_28);
    if (bVar3) {
      local_58 = std::numeric_limits<unsigned_long>::max();
    }
    else {
      ppVar6 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_QPDFWriter::NewObject>_>::
               operator->(&end);
      local_58 = ppVar6->first;
    }
    this->min_sparse = local_58;
  }
  return;
}

Assistant:

void
    resize(size_t a_size)
    {
        std::vector<T>::resize(a_size);
        if (a_size > min_sparse) {
            auto it = sparse_elements.begin();
            auto end = sparse_elements.end();
            while (it != end && it->first < a_size) {
                std::vector<T>::operator[](it->first) = std::move(it->second);
                it = sparse_elements.erase(it);
            }
            min_sparse = (it == end) ? std::numeric_limits<size_t>::max() : it->first;
        }
    }